

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_Mesh * __thiscall
ON_Mesh::CopyComponents
          (ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count,ON_Mesh *destination_mesh)

{
  ON_COMPONENT_INDEX *pOVar1;
  double *pdVar2;
  uint count;
  uint count_00;
  int iVar3;
  uint uVar4;
  ON_MeshTopologyEdge *pOVar5;
  ON_MeshTopologyVertex *pOVar6;
  ON_MeshFace *pOVar7;
  ON_3fPoint *pOVar8;
  undefined8 uVar9;
  uint *puVar10;
  double dVar11;
  float fVar12;
  bool bVar13;
  uint *puVar14;
  uint *puVar15;
  ulong uVar16;
  ON_3fVector *pOVar17;
  ON_MeshFace *pOVar18;
  ON_3fVector *pOVar19;
  ON_3fPoint *pOVar20;
  ON_3dPoint *pOVar21;
  ON_2dPoint *pOVar22;
  ON_2fPoint *pOVar23;
  ON_SurfaceCurvature *pOVar24;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar25;
  ON_MeshNgon *pOVar26;
  ON_MeshNgon *ngon;
  uint *puVar27;
  uint uVar28;
  ON_3fVector *pOVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ON_SurfaceCurvature *pOVar34;
  ON_MeshTopology *top;
  ON_MeshTopology *this_00;
  long lVar35;
  ON_SurfaceCurvature *pOVar36;
  uint uVar37;
  uint uVar38;
  size_t sVar39;
  long lVar40;
  ON_COMPONENT_INDEX ci;
  ON_SimpleArray<unsigned_int> vertex_map_buffer;
  ON_SimpleArray<unsigned_int> face_map_buffer;
  ON_MeshNgonBuffer ngon_buffer;
  ON_SurfaceCurvature *local_148;
  ON_SurfaceCurvature *local_138;
  ON_SurfaceCurvature *local_128;
  ON_3dPoint *local_110;
  undefined1 local_f8 [12];
  int iStack_ec;
  ON_SimpleArray<unsigned_int> local_e8;
  ON_SimpleArray<ON_Color> *local_d0;
  ON_SimpleArray<ON_SurfaceCurvature> *local_c8;
  ON_SimpleArray<ON_2fPoint> *local_c0;
  ON_SimpleArray<ON_3fVector> *local_b8;
  ON_SimpleArray<ON_2dPoint> *local_b0;
  ON_SimpleArray<ON_3dPoint> *local_a8;
  ON_SimpleArray<ON_3fPoint> *local_a0;
  ON_SimpleArray<unsigned_int> local_98;
  ON_MeshNgonBuffer local_80;
  
  if (ci_list == (ON_COMPONENT_INDEX *)0x0 || ci_count == 0) {
    return (ON_Mesh *)0x0;
  }
  count = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar30 = (ulong)count;
  count_00 = (this->m_F).m_count;
  uVar31 = (ulong)count_00;
  if (count_00 == 0 && count == 0) {
    return (ON_Mesh *)0x0;
  }
  uVar37 = 0;
  if ((this->m_top).m_b32IsValid == 1) {
    this_00 = &this->m_top;
    if ((this->m_top).m_b32IsValid == 0) {
      (this->m_top).m_mesh = this;
      bVar13 = ON_MeshTopology::Create(this_00);
      (this->m_top).m_b32IsValid = (uint)bVar13;
    }
  }
  else {
    this_00 = (ON_MeshTopology *)0x0;
  }
  if (this_00 == (ON_MeshTopology *)0x0) {
    uVar38 = 0;
  }
  else {
    uVar37 = (this_00->m_topv).m_count;
    uVar38 = (this_00->m_tope).m_count;
  }
  local_e8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  local_e8.m_a = (uint *)0x0;
  local_e8.m_count = 0;
  local_e8.m_capacity = 0;
  local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  local_98.m_a = (uint *)0x0;
  local_98.m_count = 0;
  local_98.m_capacity = 0;
  ON_MeshNgonBuffer::ON_MeshNgonBuffer(&local_80);
  uVar28 = 0;
  if (ci_count == 0) {
    puVar14 = (uint *)0x0;
    puVar15 = (uint *)0x0;
  }
  else {
    puVar15 = (uint *)0x0;
    puVar14 = (uint *)0x0;
    sVar39 = 0;
    do {
      local_f8._0_8_ = ci_list[sVar39];
      bVar13 = ON_COMPONENT_INDEX::IsMeshComponentIndex((ON_COMPONENT_INDEX *)local_f8);
      if (bVar13) {
        lVar35 = (long)(int)local_f8._4_4_;
        if (-1 < lVar35) {
          switch(local_f8._0_4_) {
          case 0xb:
            if ((uint)local_f8._4_4_ < count) {
              if (puVar15 == (uint *)0x0) {
                puVar15 = InitializeMap(count,&local_e8);
              }
              puVar15[lVar35] = 0;
            }
            break;
          case 0xc:
            if ((((uint)local_f8._4_4_ < uVar37) &&
                (pOVar6 = (this_00->m_topv).m_a, pOVar6[lVar35].m_vi != (int *)0x0)) &&
               (0 < pOVar6[lVar35].m_v_count)) {
              lVar40 = 0;
              do {
                uVar4 = pOVar6[lVar35].m_vi[lVar40];
                if (uVar4 < count && -1 < (int)uVar4) {
                  if (puVar15 == (uint *)0x0) {
                    puVar15 = InitializeMap(count,&local_e8);
                  }
                  puVar15[uVar4] = 0;
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 < pOVar6[lVar35].m_v_count);
            }
            break;
          case 0xd:
            if ((((uint)local_f8._4_4_ < uVar38) &&
                (pOVar5 = (this_00->m_tope).m_a, pOVar5[lVar35].m_topfi != (int *)0x0)) &&
               (0 < pOVar5[lVar35].m_topf_count)) {
              lVar40 = 0;
              do {
                uVar4 = pOVar5[lVar35].m_topfi[lVar40];
                if (uVar4 < count_00 && -1 < (int)uVar4) {
                  if (puVar14 == (uint *)0x0) {
                    puVar14 = InitializeMap(count_00,&local_98);
                  }
                  puVar14[uVar4] = 0;
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 < pOVar5[lVar35].m_topf_count);
            }
            break;
          case 0xe:
          case 0xf:
            pOVar26 = NgonFromComponentIndex(this,&local_80,(ON_COMPONENT_INDEX)local_f8._0_8_);
            if (pOVar26 != (ON_MeshNgon *)0x0) {
              if ((pOVar26->m_vi != (uint *)0x0) && (pOVar26->m_Vcount != 0)) {
                uVar16 = 0;
                do {
                  uVar4 = pOVar26->m_vi[uVar16];
                  if (uVar4 < count) {
                    if (puVar15 == (uint *)0x0) {
                      puVar15 = InitializeMap(count,&local_e8);
                    }
                    puVar15[uVar4] = 0;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 < pOVar26->m_Vcount);
              }
              if ((pOVar26->m_fi != (uint *)0x0) && (pOVar26->m_Fcount != 0)) {
                uVar16 = 0;
                do {
                  uVar4 = pOVar26->m_fi[uVar16];
                  if (uVar4 < count_00) {
                    if (puVar14 == (uint *)0x0) {
                      puVar14 = InitializeMap(count_00,&local_98);
                    }
                    puVar14[uVar4] = 0;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 < pOVar26->m_Fcount);
              }
            }
          }
        }
      }
      sVar39 = sVar39 + 1;
    } while (sVar39 != ci_count);
  }
  if (uVar31 != 0 && puVar14 != (uint *)0x0) {
    lVar35 = 0;
    uVar28 = 0;
    do {
      if (*(int *)((long)puVar14 + lVar35) == 0) {
        pOVar1 = (ON_COMPONENT_INDEX *)(((this->m_F).m_a)->vi + lVar35);
        local_f8._0_8_ = *pOVar1;
        unique0x100005e5 = pOVar1[1];
        bVar13 = ON_MeshFace::IsValid((ON_MeshFace *)local_f8,count);
        if (bVar13) {
          *(uint *)((long)puVar14 + lVar35) = uVar28;
          if (puVar15 == (uint *)0x0) {
            puVar15 = InitializeMap(count,&local_e8);
          }
          uVar28 = uVar28 + 1;
          puVar15[(int)local_f8._0_4_] = 0;
          puVar15[(int)local_f8._4_4_] = 0;
          puVar15[(int)local_f8._8_4_] = 0;
          puVar15[iStack_ec] = 0;
        }
        else {
          *(undefined4 *)((long)puVar14 + lVar35) = 0xffffffff;
        }
      }
      lVar35 = lVar35 + 4;
    } while (uVar31 * 4 - lVar35 != 0);
  }
  uVar37 = 0;
  if (puVar15 != (uint *)0x0) {
    if (uVar30 != 0) {
      uVar16 = 0;
      uVar37 = 0;
      do {
        if (puVar15[uVar16] == 0) {
          puVar15[uVar16] = uVar37;
          uVar37 = uVar37 + 1;
        }
        uVar16 = uVar16 + 1;
      } while (uVar30 != uVar16);
    }
    if (uVar37 != 0) {
      if (destination_mesh == (ON_Mesh *)0x0) {
        destination_mesh = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh(destination_mesh);
      }
      else {
        Destroy(destination_mesh);
      }
      if (uVar28 != 0) {
        pOVar7 = (this->m_F).m_a;
        uVar16 = (ulong)uVar28;
        if ((ulong)(long)(destination_mesh->m_F).m_capacity < uVar16) {
          ON_SimpleArray<ON_MeshFace>::SetCapacity(&destination_mesh->m_F,uVar16);
        }
        iVar3 = (this->m_F).m_count;
        pOVar29 = (ON_3fVector *)0x0;
        if ((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3) {
          pOVar29 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a;
        }
        pOVar17 = (ON_3fVector *)0x0;
        if (0 < iVar3) {
          pOVar17 = pOVar29;
        }
        if ((pOVar17 != (ON_3fVector *)0x0) &&
           ((ulong)(long)(destination_mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity <
            uVar16)) {
          ON_SimpleArray<ON_3fVector>::SetCapacity
                    (&(destination_mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,uVar16);
        }
        if (uVar31 != 0) {
          lVar35 = 0;
          pOVar29 = pOVar17;
          do {
            if (*(int *)((long)puVar14 + lVar35) != -1) {
              pOVar18 = ON_SimpleArray<ON_MeshFace>::AppendNew(&destination_mesh->m_F);
              pOVar18->vi[0] = puVar15[(uint)pOVar7->vi[lVar35]];
              pOVar18->vi[1] = puVar15[(uint)pOVar7->vi[lVar35 + 1]];
              pOVar18->vi[2] = puVar15[(uint)pOVar7->vi[lVar35 + 2]];
              pOVar18->vi[3] = puVar15[(uint)pOVar7->vi[lVar35 + 3]];
              if (pOVar17 != (ON_3fVector *)0x0) {
                pOVar19 = ON_SimpleArray<ON_3fVector>::AppendNew
                                    (&(destination_mesh->m_FN).super_ON_SimpleArray<ON_3fVector>);
                pOVar19->z = pOVar29->z;
                fVar12 = pOVar29->y;
                pOVar19->x = pOVar29->x;
                pOVar19->y = fVar12;
              }
            }
            lVar35 = lVar35 + 4;
            pOVar29 = pOVar29 + 1;
          } while (uVar31 << 2 != lVar35);
        }
      }
      iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar24 = (ON_SurfaceCurvature *)0x0;
      local_110 = (ON_3dPoint *)0x0;
      if (iVar3 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
        local_110 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      }
      local_138 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar3) {
        local_138 = (ON_SurfaceCurvature *)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      }
      pOVar34 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3) {
        pOVar34 = (ON_SurfaceCurvature *)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      }
      local_148 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar3) {
        local_148 = (ON_SurfaceCurvature *)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      }
      local_128 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_K).m_count == iVar3) {
        local_128 = (this->m_K).m_a;
      }
      pOVar8 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      pOVar36 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_C).m_count == iVar3) {
        pOVar36 = (ON_SurfaceCurvature *)(this->m_C).m_a;
      }
      if (iVar3 < 1) {
        pOVar36 = pOVar24;
        local_148 = pOVar24;
        local_138 = pOVar24;
        pOVar34 = pOVar24;
        local_128 = pOVar24;
      }
      uVar31 = (ulong)uVar37;
      if ((pOVar8 != (ON_3fPoint *)0x0) &&
         ((ulong)(long)(destination_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar31)
         ) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity
                  (&(destination_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,uVar31);
      }
      if ((local_110 != (ON_3dPoint *)0x0) &&
         ((ulong)(long)(destination_mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar31
         )) {
        ON_SimpleArray<ON_3dPoint>::SetCapacity
                  (&(destination_mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>,uVar31);
      }
      if ((local_138 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(destination_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar31)
         ) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(destination_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,uVar31);
      }
      if ((pOVar34 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(destination_mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar31
         )) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&(destination_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,uVar31);
      }
      if ((local_148 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(destination_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar31)
         ) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(destination_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar31);
      }
      if ((local_128 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(destination_mesh->m_K).m_capacity < uVar31)) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&destination_mesh->m_K,uVar31);
      }
      if ((pOVar36 != (ON_SurfaceCurvature *)0x0) &&
         ((ulong)(long)(destination_mesh->m_C).m_capacity < uVar31)) {
        ON_SimpleArray<ON_Color>::SetCapacity(&destination_mesh->m_C,uVar31);
      }
      if (uVar30 != 0) {
        local_a0 = &(destination_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>;
        local_a8 = &(destination_mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>;
        local_b0 = &(destination_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
        local_b8 = &(destination_mesh->m_N).super_ON_SimpleArray<ON_3fVector>;
        local_c0 = &(destination_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>;
        local_c8 = &destination_mesh->m_K;
        local_d0 = &destination_mesh->m_C;
        lVar40 = 0;
        lVar35 = 0;
        do {
          if (*(int *)((long)puVar15 + lVar35) != -1) {
            if (pOVar8 != (ON_3fPoint *)0x0) {
              pOVar20 = ON_SimpleArray<ON_3fPoint>::AppendNew(local_a0);
              pOVar20->z = *(float *)((long)&pOVar8->z + lVar40);
              uVar9 = *(undefined8 *)((long)&pOVar8->x + lVar40);
              pOVar20->x = (float)(int)uVar9;
              pOVar20->y = (float)(int)((ulong)uVar9 >> 0x20);
            }
            if (local_110 != (ON_3dPoint *)0x0) {
              pOVar21 = ON_SimpleArray<ON_3dPoint>::AppendNew(local_a8);
              pOVar21->z = *(double *)((long)&local_110->z + lVar40 * 2);
              pdVar2 = (double *)((long)&local_110->x + lVar40 * 2);
              dVar11 = pdVar2[1];
              pOVar21->x = *pdVar2;
              pOVar21->y = dVar11;
            }
            if (local_138 != (ON_SurfaceCurvature *)0x0) {
              pOVar22 = ON_SimpleArray<ON_2dPoint>::AppendNew(local_b0);
              pdVar2 = (double *)((long)&local_138->k1 + lVar35 * 4);
              dVar11 = pdVar2[1];
              pOVar22->x = *pdVar2;
              pOVar22->y = dVar11;
            }
            if (pOVar34 != (ON_SurfaceCurvature *)0x0) {
              pOVar29 = ON_SimpleArray<ON_3fVector>::AppendNew(local_b8);
              pOVar29->z = *(float *)((long)&pOVar34->k2 + lVar40);
              uVar9 = *(undefined8 *)((long)&pOVar34->k1 + lVar40);
              pOVar29->x = (float)(int)uVar9;
              pOVar29->y = (float)(int)((ulong)uVar9 >> 0x20);
            }
            if (local_148 != (ON_SurfaceCurvature *)0x0) {
              pOVar23 = ON_SimpleArray<ON_2fPoint>::AppendNew(local_c0);
              *pOVar23 = *(ON_2fPoint *)((long)&local_148->k1 + lVar35 * 2);
            }
            if (local_128 != (ON_SurfaceCurvature *)0x0) {
              pOVar24 = ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(local_c8);
              pdVar2 = (double *)((long)&local_128->k1 + lVar35 * 4);
              dVar11 = pdVar2[1];
              pOVar24->k1 = *pdVar2;
              pOVar24->k2 = dVar11;
            }
            if (pOVar36 != (ON_SurfaceCurvature *)0x0) {
              paVar25 = &ON_SimpleArray<ON_Color>::AppendNew(local_d0)->field_0;
              *paVar25 = *(anon_union_4_2_6147a14e_for_ON_Color_15 *)((long)&pOVar36->k1 + lVar35);
            }
          }
          lVar35 = lVar35 + 4;
          lVar40 = lVar40 + 0xc;
        } while (uVar30 * 4 - lVar35 != 0);
      }
      uVar37 = NgonCount(this);
      if (uVar37 != 0) {
        uVar38 = 0;
        do {
          pOVar26 = Ngon(this,uVar38);
          if (((((pOVar26 != (ON_MeshNgon *)0x0) && (uVar28 = pOVar26->m_Vcount, uVar28 != 0)) &&
               (puVar27 = pOVar26->m_vi, puVar27 != (uint *)0x0)) &&
              ((uVar4 = pOVar26->m_Fcount, uVar4 != 0 &&
               (puVar10 = pOVar26->m_fi, puVar10 != (uint *)0x0)))) &&
             (uVar33 = *puVar27, uVar33 < count)) {
            bVar13 = true;
            uVar32 = 1;
            do {
              if (puVar15[uVar33] == 0xffffffff) break;
              if (uVar28 == uVar32) goto LAB_0051bc60;
              bVar13 = uVar32 < uVar28;
              uVar33 = puVar27[uVar32];
              uVar32 = uVar32 + 1;
            } while (uVar33 < count);
            if (!bVar13) {
LAB_0051bc60:
              uVar33 = *puVar10;
              if (uVar33 < count_00) {
                bVar13 = true;
                uVar32 = 1;
                do {
                  if (puVar14[uVar33] == 0xffffffff) break;
                  if (uVar4 + (uVar4 == 0) == uVar32) goto LAB_0051bcb1;
                  bVar13 = uVar32 < uVar4;
                  uVar33 = puVar10[uVar32];
                  uVar32 = uVar32 + 1;
                } while (uVar33 < count_00);
                if (!bVar13) {
LAB_0051bcb1:
                  ngon = AllocateNgon(destination_mesh,uVar28,uVar4);
                  ngon->m_Vcount = 0;
                  ngon->m_Fcount = 0;
                  if (pOVar26->m_Vcount != 0) {
                    puVar27 = pOVar26->m_vi;
                    puVar10 = ngon->m_vi;
                    uVar31 = 0;
                    do {
                      uVar28 = puVar15[puVar27[uVar31]];
                      uVar4 = ngon->m_Vcount;
                      ngon->m_Vcount = uVar4 + 1;
                      puVar10[uVar4] = uVar28;
                      uVar31 = uVar31 + 1;
                    } while (uVar31 < pOVar26->m_Vcount);
                  }
                  if (pOVar26->m_Fcount != 0) {
                    puVar27 = pOVar26->m_fi;
                    puVar10 = ngon->m_fi;
                    uVar31 = 0;
                    do {
                      uVar28 = puVar14[puVar27[uVar31]];
                      uVar4 = ngon->m_Fcount;
                      ngon->m_Fcount = uVar4 + 1;
                      puVar10[uVar4] = uVar28;
                      uVar31 = uVar31 + 1;
                    } while (uVar31 < pOVar26->m_Fcount);
                  }
                  AddNgon(destination_mesh,ngon);
                  puVar27 = NgonMap(this);
                  if (puVar27 != (uint *)0x0) {
                    CreateNgonMap(destination_mesh);
                  }
                }
              }
            }
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar37);
      }
      goto LAB_0051bd5d;
    }
  }
  destination_mesh = (ON_Mesh *)0x0;
LAB_0051bd5d:
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_98);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_e8);
  return destination_mesh;
}

Assistant:

ON_Mesh* ON_Mesh::CopyComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count,
  class ON_Mesh* destination_mesh
  ) const
{
  if ( ci_count <= 0 || 0 == ci_list )
    return 0;

  const unsigned int vertex_count = m_V.UnsignedCount();
  const unsigned int face_count = m_F.UnsignedCount();

  if ( vertex_count <= 0 && face_count <= 0 )
    return 0;

  const ON_MeshTopology* top = TopologyExists() ? &Topology() : 0;
  const unsigned int topv_count = top ? top->m_topv.UnsignedCount() : 0;
  const unsigned int tope_count = top ? top->m_tope.UnsignedCount() : 0;
  
  ON_SimpleArray< unsigned int > vertex_map_buffer;
  ON_SimpleArray< unsigned int > face_map_buffer;

  unsigned int* vertex_map = 0;
  unsigned int* face_map = 0;
  unsigned int i, fi, vi;

  ON_MeshNgonBuffer ngon_buffer;
  
  for ( size_t ci_index = 0; ci_index < ci_count; ci_index++ )
  {
    ON_COMPONENT_INDEX ci = ci_list[ci_index];
    if ( !ci.IsMeshComponentIndex() )
      continue;
    if ( ci.m_index < 0 )
      continue;
    i = (unsigned int)ci.m_index;

    switch(ci.m_type)
    {
    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( i >= vertex_count )
        break;
      if ( 0 == vertex_map )
        vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
      vertex_map[i] = 0;
      break;

    case ON_COMPONENT_INDEX::mesh_face:
    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = NgonFromComponentIndex(ngon_buffer,ci);
        if ( 0 == ngon )
          break;
        if ( 0 != ngon->m_vi )
        {
          for ( i = 0; i < ngon->m_Vcount; i++ )
          {
            vi = ngon->m_vi[i];
            if ( vi >= vertex_count )
              continue;
            if ( 0 == vertex_map )
              vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
            vertex_map[vi] = 0;
          }
        }
        if ( 0 != ngon->m_fi )
        {
          for ( i = 0; i < ngon->m_Fcount; i++ )
          {
            fi = ngon->m_fi[i];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_vertex:
      if ( i < topv_count )
      {
        const ON_MeshTopologyVertex& v = top->m_topv[i];
        if ( v.m_vi )
        {
          for ( int j = 0; j < v.m_v_count; j++ )
          {
            if ( v.m_vi[j] < 0 )
              continue;
            vi = (unsigned int)v.m_vi[j];
            if ( vi < vertex_count )
            {
              if ( 0 == vertex_map )
                vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
              vertex_map[vi] = 0;
            }
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_edge:
      if ( i < tope_count )
      {
        const ON_MeshTopologyEdge& e = top->m_tope[i];
        if ( e.m_topfi )
        {
          for ( int j = 0; j < e.m_topf_count; j++ )
          {
            if ( e.m_topfi[j] < 0 )
              continue;
            fi = (unsigned int)e.m_topfi[j];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    default:
      break;
    }
  }

  unsigned int face_count1 = 0;
  if ( 0 != face_map )
  {
    for ( i = 0; i < face_count; i++ )
    {
      if ( 0 == face_map[i] )
      {
        ON_MeshFace f = m_F[i];
        if ( f.IsValid(vertex_count) )
        {
          face_map[i] = face_count1++;
          if ( 0 == vertex_map )
            vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
          vertex_map[f.vi[0]] = 0;
          vertex_map[f.vi[1]] = 0;
          vertex_map[f.vi[2]] = 0;
          vertex_map[f.vi[3]] = 0;
        }
        else
          face_map[i] = ON_UNSET_UINT_INDEX; // bogus input face
      }
    }
  }

  if ( 0 == vertex_map )
    return 0;

  unsigned int vertex_count1 = 0;
  for ( i = 0; i < vertex_count; i++ )
  {
    if ( 0 == vertex_map[i] )
      vertex_map[i] = vertex_count1++;
  }

  if ( vertex_count1 <= 0 )
    return 0;

  ON_Mesh* mesh_copy = 0;
  if ( destination_mesh )
  {
    destination_mesh->Destroy();
    mesh_copy = destination_mesh;
  }
  else
  {
    mesh_copy = new ON_Mesh();
  }

  if ( face_count1 > 0 )
  {
    // copy face information
    const ON_MeshFace* F = m_F.Array();
    mesh_copy->m_F.Reserve(face_count1);
    const ON_3fVector* FN = HasFaceNormals() ? m_FN.Array() : 0;
    if ( 0 != FN )
      mesh_copy->m_FN.Reserve(face_count1);
    const unsigned int* fvi;
    unsigned int* fvi1;
    for ( fi = 0; fi < face_count; fi++ )
    {
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        continue;
      fvi = (const unsigned int*)F[fi].vi;
      fvi1 = (unsigned int*)(mesh_copy->m_F.AppendNew().vi);
      fvi1[0] = vertex_map[fvi[0]];
      fvi1[1] = vertex_map[fvi[1]];
      fvi1[2] = vertex_map[fvi[2]];
      fvi1[3] = vertex_map[fvi[3]];
      if ( FN )
        mesh_copy->m_FN.AppendNew() = FN[fi];
    }
  }

  const bool bValidSingles = (VertexUnsignedCount() == m_V.UnsignedCount());
  const ON_3fPoint* fV = bValidSingles ? m_V.Array() : nullptr;
  const bool bValidDoubles = (VertexUnsignedCount() == m_dV.UnsignedCount());
  const ON_3dPoint* dV = bValidDoubles ? m_dV.Array() : nullptr;
  const ON_2dPoint* S = HasSurfaceParameters() ? m_S.Array() : 0;
  const ON_3fVector* N = HasVertexNormals() ? m_N.Array() : 0;
  const ON_2fPoint* T = HasTextureCoordinates() ? m_T.Array() : 0;
  const ON_SurfaceCurvature* K = HasPrincipalCurvatures() ? m_K.Array() : 0;
  const ON_Color* C = HasVertexColors() ? m_C.Array() : 0;

  if (fV)
    mesh_copy->m_V.Reserve(vertex_count1);
  if (dV)
    mesh_copy->m_dV.Reserve(vertex_count1);
  if (S)
    mesh_copy->m_S.Reserve(vertex_count1);
  if (N)
    mesh_copy->m_N.Reserve(vertex_count1);
  if (T)
    mesh_copy->m_T.Reserve(vertex_count1);
  if (K)
    mesh_copy->m_K.Reserve(vertex_count1);
  if (C)
    mesh_copy->m_C.Reserve(vertex_count1);

  for ( vi = 0; vi < vertex_count; vi++ )
  {
    if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
      continue;
    if (fV)
      mesh_copy->m_V.AppendNew() = fV[vi];
    if (dV)
      mesh_copy->m_dV.AppendNew() = dV[vi];
    if ( S )
      mesh_copy->m_S.AppendNew() = S[vi];
    if ( N )
      mesh_copy->m_N.AppendNew() = N[vi];
    if ( T )
      mesh_copy->m_T.AppendNew() = T[vi];
    if ( K )
      mesh_copy->m_K.AppendNew() = K[vi];
    if ( C )
      mesh_copy->m_C.AppendNew() = C[vi];
  }

  const unsigned int ngon_count = NgonCount();
  for ( unsigned int ngon_index = 0; ngon_index < ngon_count; ngon_index++ )
  {
    const ON_MeshNgon* ngon = Ngon(ngon_index);
    if ( 0 == ngon )
      continue;
    if ( 0 == ngon->m_Vcount || 0 == ngon->m_vi )
      continue;
    if ( 0 == ngon->m_Fcount || 0 == ngon->m_fi )
      continue;
    
    unsigned int j;
    
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      vi = ngon->m_vi[j];
      if ( vi >= vertex_count )
        break;
      if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
        break;
    }
    if ( j < ngon->m_Vcount )
      continue;

    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      fi = ngon->m_fi[j];
      if ( fi >= face_count )
        break;
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        break;
    }
    if ( j < ngon->m_Fcount )
      continue;

    ON_MeshNgon* ngon1 = mesh_copy->AllocateNgon(ngon->m_Vcount,ngon->m_Fcount);

    ngon1->m_Vcount = 0;
    ngon1->m_Fcount = 0;
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      ngon1->m_vi[ngon1->m_Vcount++] = vertex_map[ngon->m_vi[j]];
    }
    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      ngon1->m_fi[ngon1->m_Fcount++] = face_map[ngon->m_fi[j]];
    }

    mesh_copy->AddNgon(ngon1);

    if ( 0 != NgonMap() )
      mesh_copy->CreateNgonMap();
  }

  return mesh_copy;
}